

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<kj::Rc<kj::Refcounted>_> * __thiscall
kj::_::ExceptionOr<kj::Rc<kj::Refcounted>_>::operator=
          (ExceptionOr<kj::Rc<kj::Refcounted>_> *this,ExceptionOr<kj::Rc<kj::Refcounted>_> *param_1)

{
  Refcounted *pRVar1;
  Disposer *pDVar2;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      pRVar1 = (this->value).ptr.field_1.value.own.ptr;
      if (pRVar1 != (Refcounted *)0x0) {
        (this->value).ptr.field_1.value.own.ptr = (Refcounted *)0x0;
        pDVar2 = (this->value).ptr.field_1.value.own.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,(pRVar1->super_Disposer)._vptr_Disposer[-2] +
                          (long)&(pRVar1->super_Disposer)._vptr_Disposer);
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      (this->value).ptr.field_1.value.own.disposer = (param_1->value).ptr.field_1.value.own.disposer
      ;
      (this->value).ptr.field_1.value.own.ptr = (param_1->value).ptr.field_1.value.own.ptr;
      (param_1->value).ptr.field_1.value.own.ptr = (Refcounted *)0x0;
      (this->value).ptr.isSet = true;
    }
  }
  if ((param_1->value).ptr.isSet == true) {
    (param_1->value).ptr.isSet = false;
    pRVar1 = (param_1->value).ptr.field_1.value.own.ptr;
    if (pRVar1 != (Refcounted *)0x0) {
      (param_1->value).ptr.field_1.value.own.ptr = (Refcounted *)0x0;
      pDVar2 = (param_1->value).ptr.field_1.value.own.disposer;
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(pRVar1->super_Disposer)._vptr_Disposer[-2] +
                        (long)&(pRVar1->super_Disposer)._vptr_Disposer);
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;